

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.h
# Opt level: O1

void __thiscall
CPartialMerkleTree::SerializationOps<VectorWriter,CPartialMerkleTree_const,ActionSerialize>
          (CPartialMerkleTree *this,VectorWriter *obj,undefined8 param_3,size_t param_4)

{
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  anon_class_8_1_a7b7af8b local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,this->nTransactions);
  VectorWriter::write(obj,(int)&local_48,(void *)0x4,param_4);
  VectorFormatter<DefaultFormatter>::Ser<VectorWriter,std::vector<uint256,std::allocator<uint256>>>
            ((VectorFormatter<DefaultFormatter> *)&local_48,obj,&this->vHash);
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.bytes = &local_48;
  ActionSerialize::
  SerWrite<VectorWriter,CPartialMerkleTree_const&,CPartialMerkleTree::SerializationOps<VectorWriter,CPartialMerkleTree_const,ActionSerialize>(CPartialMerkleTree_const&,VectorWriter&,ActionSerialize)::_lambda(VectorWriter&,CPartialMerkleTree_const&)_1_>
            (obj,this,&local_50);
  SerializeMany<VectorWriter,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (obj,&local_48);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CPartialMerkleTree, obj)
    {
        READWRITE(obj.nTransactions, obj.vHash);
        std::vector<unsigned char> bytes;
        SER_WRITE(obj, bytes = BitsToBytes(obj.vBits));
        READWRITE(bytes);
        SER_READ(obj, obj.vBits = BytesToBits(bytes));
        SER_READ(obj, obj.fBad = false);
    }